

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

void auto_arima_setOptMethod(auto_arima_object obj,int value)

{
  int value_local;
  auto_arima_object obj_local;
  
  if (value == 0) {
    obj->optmethod = 0;
  }
  else if (value == 1) {
    obj->optmethod = 1;
  }
  else if (value == 2) {
    obj->optmethod = 2;
  }
  else if (value == 3) {
    obj->optmethod = 3;
  }
  else if (value == 4) {
    obj->optmethod = 4;
  }
  else if (value == 5) {
    obj->optmethod = 5;
  }
  else if (value == 6) {
    obj->optmethod = 6;
  }
  else if (value == 7) {
    obj->optmethod = 7;
  }
  else {
    printf("\n Acceptable Numerical Values 0,1,2,3,4,5,6,7 \n");
    printf("\n Method 0 - Nelder-Mead \n");
    printf("\n Method 1 - Newton Line Search \n");
    printf("\n Method 2 - Newton Trust Region - Hook Step \n");
    printf("\n Method 3 - Newton Trust Region - Double Dog-Leg \n");
    printf("\n Method 4 - Conjugate Gradient \n");
    printf("\n Method 5 - BFGS \n");
    printf("\n Method 6 - Limited Memory BFGS \n");
    printf("\n Method 7 - BFGS More-Thuente Line Search \n");
  }
  return;
}

Assistant:

void auto_arima_setOptMethod(auto_arima_object obj, int value) {
	/*
	* Method 0 - Nelder-Mead
	* Method 1 - Newton Line Search
	* Method 2 - Newton Trust Region - Hook Step
	* Method 3 - Newton Trust Region - Double Dog-Leg
	* Method 4 - Conjugate Gradient
	* Method 5 - BFGS
	* Method 6 - Limited Memory BFGS
	* Method 7 - BFGS More-Thuente Line Search
	*/
	if (value == 0) {
		obj->optmethod = 0;
	}
	else if (value == 1) {
		obj->optmethod = 1;
	}
	else if (value == 2) {
		obj->optmethod = 2;
	}
	else if (value == 3) {
		obj->optmethod = 3;
	}
	else if (value == 4) {
		obj->optmethod = 4;
	}
	else if (value == 5) {
		obj->optmethod = 5;
	}
	else if (value == 6) {
		obj->optmethod = 6;
	}
	else if (value == 7) {
		obj->optmethod = 7;
	}
	else {
		printf("\n Acceptable Numerical Values 0,1,2,3,4,5,6,7 \n");
		printf("\n Method 0 - Nelder-Mead \n");
		printf("\n Method 1 - Newton Line Search \n");
		printf("\n Method 2 - Newton Trust Region - Hook Step \n");
		printf("\n Method 3 - Newton Trust Region - Double Dog-Leg \n");
		printf("\n Method 4 - Conjugate Gradient \n");
		printf("\n Method 5 - BFGS \n");
		printf("\n Method 6 - Limited Memory BFGS \n");
		printf("\n Method 7 - BFGS More-Thuente Line Search \n");
	}
}